

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall
stringToUnits_measurementTypes_Test::TestBody(stringToUnits_measurementTypes_Test *this)

{
  float fVar1;
  unit_data uVar2;
  uint64_t uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  unit local_88;
  float local_7c;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  precise_unit local_68;
  float local_58;
  unit_data local_54;
  string local_50;
  string local_30;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  
  auVar5._0_4_ = units::detail::power_const<float>(1.0,2);
  auVar5._4_12_ = extraout_var;
  local_7c = auVar5._0_4_;
  units::detail::unit_data::pow((unit_data *)((long)&units::m + 4),auVar5._0_8_,in_XMM1_Qa);
  fVar1 = local_7c;
  local_58 = local_7c;
  uVar2 = units::detail::unit_data::operator*((unit_data *)((long)&units::pu + 4),&local_54);
  local_88.base_units_ = uVar2;
  local_88.multiplier_ = fVar1;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"pu*area","");
  uVar3 = units::getDefaultFlags();
  local_68 = units::unit_from_string(&local_30,uVar3);
  testing::internal::CmpHelperEQ<units::unit,units::precise_unit>
            (local_78,"pu * m.pow(2)","unit_from_string(\"pu*area\")",&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x213,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_68.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  auVar6._0_4_ = units::detail::power_const<float>(1.0,2);
  auVar6._4_12_ = extraout_var_00;
  local_7c = auVar6._0_4_;
  units::detail::unit_data::pow((unit_data *)((long)&units::m + 4),auVar6._0_8_,in_XMM1_Qa);
  local_58 = local_7c;
  local_88.base_units_ =
       units::detail::unit_data::operator*((unit_data *)((long)&units::percent + 4),&local_54);
  local_88.multiplier_ = local_7c * 0.01;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"percent*Area","");
  uVar3 = units::getDefaultFlags();
  local_68 = units::unit_from_string(&local_50,uVar3);
  testing::internal::CmpHelperEQ<units::unit,units::precise_unit>
            (local_78,"percent * m.pow(2)","unit_from_string(\"percent*Area\")",&local_88,&local_68)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x214,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_68.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(stringToUnits, measurementTypes)
{
    EXPECT_EQ(pu * m.pow(2), unit_from_string("pu*area"));
    EXPECT_EQ(percent * m.pow(2), unit_from_string("percent*Area"));
}